

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O2

bool __thiscall translate::hit(translate *this,ray *r,interval ray_t,hit_record *rec)

{
  element_type *peVar1;
  int iVar2;
  double local_58;
  double dStack_50;
  double local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  double local_30;
  double local_28;
  
  local_48 = (r->orig).e[2] - (this->offset).e[2];
  local_28 = r->tm;
  local_58 = (r->orig).e[0] - (this->offset).e[0];
  dStack_50 = (r->orig).e[1] - (this->offset).e[1];
  local_40 = *(undefined4 *)(r->dir).e;
  uStack_3c = *(undefined4 *)((long)(r->dir).e + 4);
  uStack_38 = *(undefined4 *)((r->dir).e + 1);
  uStack_34 = *(undefined4 *)((long)(r->dir).e + 0xc);
  local_30 = (r->dir).e[2];
  peVar1 = (this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_hittable[2])(ray_t.min,ray_t.max,peVar1,&local_58);
  if (SUB41(iVar2,0) != false) {
    vec3::operator+=(&rec->p,&this->offset);
  }
  return SUB41(iVar2,0);
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        // Move the ray backwards by the offset
        ray offset_r(r.origin() - offset, r.direction(), r.time());

        // Determine whether an intersection exists along the offset ray (and if so, where)
        if (!object->hit(offset_r, ray_t, rec))
            return false;

        // Move the intersection point forwards by the offset
        rec.p += offset;

        return true;
    }